

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,unsigned_long value,
          basic_format_specs<char> *specs)

{
  bool bVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  unsigned_long uVar7;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_38;
  char local_28 [32];
  
  sVar6 = 2;
  uVar7 = value;
  do {
    sVar5 = sVar6;
    sVar6 = sVar5 + 1;
    bVar1 = 0xf < uVar7;
    uVar7 = uVar7 >> 4;
  } while (bVar1);
  local_38.num_digits = (int)sVar5 + -1;
  local_38.value = value;
  if (specs == (basic_format_specs<char> *)0x0) {
    if ((out.container)->capacity_ < (out.container)->size_ + 1) {
      (**(out.container)->_vptr_buffer)(out.container);
    }
    sVar6 = (out.container)->size_;
    (out.container)->size_ = sVar6 + 1;
    (out.container)->ptr_[sVar6] = '0';
    if ((out.container)->capacity_ < (out.container)->size_ + 1) {
      (**(out.container)->_vptr_buffer)(out.container);
    }
    sVar6 = (out.container)->size_;
    (out.container)->size_ = sVar6 + 1;
    (out.container)->ptr_[sVar6] = 'x';
    lVar3 = (long)local_38.num_digits;
    if (lVar3 < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    pcVar4 = local_28 + lVar3 + -1;
    uVar7 = local_38.value;
    do {
      *pcVar4 = "0123456789abcdef"[(uint)uVar7 & 0xf];
      pcVar4 = pcVar4 + -1;
      bVar1 = 0xf < uVar7;
      uVar7 = uVar7 >> 4;
    } while (bVar1);
    bVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      (local_28,local_28 + lVar3,out);
  }
  else {
    bVar2 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long,fmt::v7::basic_format_specs<char>const*)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_&>
                      (out,specs,sVar6,sVar6,&local_38);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar2.container;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}